

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

bool __thiscall
r_comp::RepliStruct::parseDirective
          (RepliStruct *this,istream *stream,uint64_t *curIndent,uint64_t *prevIndent)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int64_t iVar5;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  uint local_70;
  undefined4 local_6c;
  uint paramCount;
  char c;
  allocator local_51;
  string local_50 [8];
  string str;
  uint64_t *prevIndent_local;
  uint64_t *curIndent_local;
  istream *stream_local;
  RepliStruct *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"!",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  while( true ) {
    bVar2 = std::ios::eof();
    bVar1 = false;
    if ((bVar2 & 1) == 0) {
      paramCount._3_1_ = std::istream::peek();
      bVar1 = ' ' < paramCount._3_1_;
    }
    if (!bVar1) break;
    cVar3 = std::istream::get();
    std::__cxx11::string::operator+=(local_50,cVar3);
  }
  bVar2 = std::ios::eof();
  if ((bVar2 & 1) == 0) {
    local_70 = 0;
    iVar4 = std::__cxx11::string::compare((char *)local_50);
    if (iVar4 == 0) {
      local_70 = 2;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      if (iVar4 == 0) {
        local_70 = 2;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_50);
        if (iVar4 == 0) {
          local_70 = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_50);
          if (iVar4 == 0) {
            this->type = Condition;
            local_70 = 1;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)local_50);
            if (iVar4 == 0) {
              this->type = Condition;
              local_70 = 1;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)local_50);
              if (iVar4 == 0) {
                this->type = Condition;
                local_70 = 0;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)local_50);
                if (iVar4 == 0) {
                  this->type = Condition;
                  local_70 = 0;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)local_50);
                  if ((((iVar4 != 0) &&
                       (iVar4 = std::__cxx11::string::compare((char *)local_50), iVar4 != 0)) &&
                      (iVar4 = std::__cxx11::string::compare((char *)local_50), iVar4 != 0)) &&
                     (iVar4 = std::__cxx11::string::compare((char *)local_50), iVar4 != 0)) {
                    std::operator+((char *)local_b0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"Unknown directive: \'");
                    std::operator+(local_90,(char *)local_b0);
                    std::__cxx11::string::operator+=((string *)&this->error,(string *)local_90);
                    std::__cxx11::string::~string((string *)local_90);
                    std::__cxx11::string::~string(local_b0);
                    this_local._7_1_ = false;
                    goto LAB_00184782;
                  }
                  local_70 = 1;
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::operator=((string *)&this->cmd,local_50);
    if (local_70 == 0) {
      while( true ) {
        bVar2 = std::ios::eof();
        bVar1 = false;
        if ((bVar2 & 1) == 0) {
          iVar4 = std::istream::peek();
          bVar1 = 0xd < iVar4;
        }
        if (!bVar1) break;
        std::istream::get();
      }
      while( true ) {
        bVar2 = std::ios::eof();
        bVar1 = false;
        if ((bVar2 & 1) == 0) {
          iVar4 = std::istream::peek();
          bVar1 = iVar4 < 0x20;
        }
        if (!bVar1) break;
        iVar4 = std::istream::get();
        if (iVar4 == 10) {
          GlobalLine = GlobalLine + 1;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      iVar5 = parse(this,stream,curIndent,prevIndent,(ulong)local_70);
      if (iVar5 == 0) {
        this_local._7_1_ = true;
      }
      else {
        std::operator+((char *)local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Error parsing the arguments for directive \'");
        std::operator+(local_d0,(char *)local_f0);
        std::__cxx11::string::operator+=((string *)&this->error,(string *)local_d0);
        std::__cxx11::string::~string((string *)local_d0);
        std::__cxx11::string::~string(local_f0);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    std::__cxx11::string::operator+=
              ((string *)&this->error,
               "Error in directive formatting, end of file reached unexpectedly. ");
    this_local._7_1_ = false;
  }
LAB_00184782:
  local_6c = 1;
  std::__cxx11::string::~string(local_50);
  return this_local._7_1_;
}

Assistant:

bool RepliStruct::parseDirective(std::istream *stream, uint64_t &curIndent, uint64_t &prevIndent)
{
    std::string str = "!";
    // RepliStruct* subStruct;
    char c;

    // We know that parent read a '!', so first find out which directive
    while ((!stream->eof()) && ((c = stream->peek()) > 32)) {
        str += stream->get();
    }

    if (stream->eof()) {
        error += "Error in directive formatting, end of file reached unexpectedly. ";
        return false;
    }

    unsigned int paramCount = 0;

    if (str.compare("!def") == 0) { // () ()
        paramCount = 2;
    } else if (str.compare("!counter") == 0) { // xxx val
        paramCount = 2;
    } else if (str.compare("!undef") == 0) { // xxx
        paramCount = 1;
    } else if (str.compare("!ifdef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!ifundef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!else") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!endif") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!class") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!op") == 0) { // ():xxx
        paramCount = 1;
    } else if (str.compare("!dfn") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!load") == 0) { // xxx
        paramCount = 1;
    } else {
        error += "Unknown directive: '" + str + "'. ";
        return false;
    }

    cmd = str;

    if (paramCount == 0) {
        // read until end of line, including any comments
        while ((!stream->eof()) && (stream->peek() > 13)) {
            stream->get();
        }

        // read the end of line too
        while ((!stream->eof()) && (stream->peek() < 32))
            if (stream->get() == '\n') {
                GlobalLine++;
            }

        return true;
    }

    if (parse(stream, curIndent, prevIndent, paramCount) != 0) {
        error += "Error parsing the arguments for directive '" + cmd + "'. ";
        return false;
    } else {
        return true;
    }
}